

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::PathBuilderCheckPathAfterVerificationTest_TestVerifyErrorMulipleMapping_Test::
~PathBuilderCheckPathAfterVerificationTest_TestVerifyErrorMulipleMapping_Test
          (PathBuilderCheckPathAfterVerificationTest_TestVerifyErrorMulipleMapping_Test *this)

{
  PathBuilderCheckPathAfterVerificationTest_TestVerifyErrorMulipleMapping_Test *this_local;
  
  PathBuilderCheckPathAfterVerificationTest::~PathBuilderCheckPathAfterVerificationTest
            (&this->super_PathBuilderCheckPathAfterVerificationTest);
  return;
}

Assistant:

TEST_F(PathBuilderCheckPathAfterVerificationTest,
       TestVerifyErrorMulipleMapping) {
  AddWarningPathBuilderDelegate delegate;
  CertPathBuilder::Result result = RunPathBuilder(nullptr, &delegate);
  ASSERT_TRUE(result.HasValidPath());

  CertErrors *errors =
      (CertErrors *)result.GetBestValidPath()->errors.GetErrorsForCert(1);
  errors->AddError(cert_errors::kEkuNotPresent, nullptr);
  errors->AddError(cert_errors::kNoValidPolicy, nullptr);

  VerifyError error = result.GetBestPathVerifyError();
  ASSERT_EQ(error.Code(), VerifyError::StatusCode::PATH_MULTIPLE_ERRORS)
      << error.DiagnosticString();
}